

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  long lVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  long lVar4;
  int i_start;
  long lVar5;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar3 = GImGui->NavWindowingTarget;
  if (pIVar3 == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindowingTarget",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xb17,"void NavUpdateWindowingHighlightWindow(int)");
  }
  if ((pIVar3->Flags & 0x8000000) == 0) {
    lVar4 = (long)(GImGui->Windows).Size;
    do {
      if (lVar4 < 1) {
        lVar5 = 0xffffffff;
        break;
      }
      lVar5 = lVar4 + -1;
      lVar1 = lVar4 + -1;
      lVar4 = lVar5;
    } while ((GImGui->Windows).Data[lVar1] != pIVar3);
    pIVar3 = FindWindowNavigable((int)lVar5 + focus_change_dir,-0x7fffffff,focus_change_dir);
    if (pIVar3 == (ImGuiWindow *)0x0) {
      i_start = 0;
      if (focus_change_dir < 0) {
        i_start = (pIVar2->Windows).Size + -1;
      }
      pIVar3 = FindWindowNavigable(i_start,(int)lVar5,focus_change_dir);
    }
    pIVar2->NavWindowingTarget = pIVar3;
    pIVar2->NavWindowingToggleLayer = false;
  }
  return;
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = FindWindowIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavigable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavigable((focus_change_dir < 0) ? (g.Windows.Size - 1) : 0, i_current, focus_change_dir);
    g.NavWindowingTarget = window_target;
    g.NavWindowingToggleLayer = false;
}